

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O3

UINT8 __thiscall S98Player::SetDeviceMuting(S98Player *this,UINT32 id,PLR_MUTE_OPTS *muteOpts)

{
  void *pvVar1;
  DEVFUNC_OPTMASK p_Var2;
  bool bVar3;
  PLR_DEV_OPTS *pPVar4;
  undefined3 uVar5;
  UINT32 UVar6;
  UINT8 UVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  VGM_BASEDEV *clDev;
  pointer pSVar11;
  
  sVar8 = DeviceID2OptionID(this,id);
  if (sVar8 == 0xffffffffffffffff) {
    UVar7 = 0x80;
  }
  else {
    this->_devOpts[sVar8].muteOpts.chnMute[1] = muteOpts->chnMute[1];
    uVar5 = *(undefined3 *)&muteOpts->field_0x1;
    UVar6 = muteOpts->chnMute[0];
    pPVar4 = this->_devOpts + sVar8;
    (pPVar4->muteOpts).disable = muteOpts->disable;
    *(undefined3 *)&(pPVar4->muteOpts).field_0x1 = uVar5;
    (pPVar4->muteOpts).chnMute[0] = UVar6;
    pSVar11 = (this->_devices).
              super__Vector_base<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this->_optDevMap[sVar8] <
        (ulong)(((long)(this->_devices).
                       super__Vector_base<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11 >> 6) *
               -0x5555555555555555)) {
      pSVar11 = pSVar11 + this->_optDevMap[sVar8];
      bVar10 = 1;
      lVar9 = 0;
      do {
        pvVar1 = (pSVar11->base).defInf.dataPtr;
        if ((pvVar1 != (void *)0x0) &&
           (p_Var2 = ((pSVar11->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0))
        {
          (*p_Var2)(pvVar1,this->_devOpts[sVar8].muteOpts.chnMute[lVar9]);
        }
        pSVar11 = (pointer)(pSVar11->base).linkDev;
        lVar9 = 1;
        UVar7 = '\0';
        bVar3 = (bool)(bVar10 & pSVar11 != (pointer)0x0);
        bVar10 = 0;
      } while (bVar3);
    }
    else {
      UVar7 = '\0';
    }
  }
  return UVar7;
}

Assistant:

UINT8 S98Player::SetDeviceMuting(UINT32 id, const PLR_MUTE_OPTS& muteOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID].muteOpts = muteOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}